

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
anon_unknown.dwarf_68d51::substituteEnvironmentVariable
          (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *value)

{
  long lVar1;
  ulong uVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string temp;
  string envVariableName;
  bool local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = std::__cxx11::string::find((char *)value,0x1bbbb0);
  if (lVar1 == -1) {
    local_90._0_8_ = "";
    local_90[8] = true;
  }
  else {
    uVar2 = std::__cxx11::string::find((char *)value,0x1bbb92);
    if (lVar1 != -3) {
      std::__cxx11::string::substr((ulong)local_90,(ulong)value);
      __s = getenv((char *)local_90._0_8_);
      if (__s == (char *)0x0) {
        local_d3 = false;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Unable to find environment variable \'",&local_d1);
        std::operator+(&local_d0,&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\'",&local_d2);
        std::operator+(&local_b0,&local_d0,&local_50);
        std::
        tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,&local_d3,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
        this = &local_70;
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,(string *)value);
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
        std::__cxx11::string::operator=((string *)value,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,__s,(allocator<char> *)&local_70);
        std::__cxx11::string::append((string *)value);
        std::__cxx11::string::~string((string *)&local_d0);
        if (uVar2 < local_b0._M_string_length - 1) {
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
          std::__cxx11::string::append((string *)value);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        substituteEnvironmentVariable(__return_storage_ptr__,value);
        this = &local_b0;
      }
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)local_90);
      return __return_storage_ptr__;
    }
    local_90._0_8_ = "failed to find } to go with ${";
    local_90[8] = false;
  }
  std::_Tuple_impl<0ul,bool,std::__cxx11::string>::_Tuple_impl<bool,char_const*>
            ((_Tuple_impl<0ul,bool,std::__cxx11::string> *)__return_storage_ptr__,
             (_Tuple_impl<0UL,_bool,_const_char_*> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, std::string> substituteEnvironmentVariable(std::string& value)
{
    auto index = value.find("${");
    if (index == std::string::npos)
        return std::make_tuple(true, "");
    index += 2; // advance past the "${".
    auto endIndex = value.find("}", index);
    if (index == std::string::npos)
        return std::make_tuple(false, "failed to find } to go with ${");
    std::string envVariableName = value.substr(index, endIndex - index);
    const char* envVariableValue = getenv(envVariableName.c_str());
    if (envVariableValue == nullptr)
        return std::make_tuple(false, std::string("Unable to find environment variable '") + envVariableName + std::string("'"));

    std::string temp(value);
    value = temp.substr(0, index - 2); // up until the starting ${
    value += std::string(envVariableValue);
    if (endIndex < (temp.length()-1))
        value += temp.substr(endIndex + 1, temp.length() - endIndex - 1);
    return substituteEnvironmentVariable(value);
}